

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::checkTransferFunction
          (AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
           *this,CFG *cfg,Element *x,Element *y,Element *z)

{
  Element *second;
  BasicBlock *bb;
  Element local_c8;
  Element local_a0;
  Element local_78;
  BasicBlock *local_50;
  Element *local_48;
  Element *local_40;
  Element *local_38;
  
  bb = *(BasicBlock **)cfg;
  local_50 = *(BasicBlock **)&cfg->field_0x8;
  if (bb != local_50) {
    local_48 = z;
    local_40 = x;
    local_38 = y;
    do {
      std::vector<bool,_std::allocator<bool>_>::vector(&local_78.bitvector,&local_40->bitvector);
      analysis::
      VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ::transfer(&this->txfn->
                  super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                 ,bb,&local_78);
      std::vector<bool,_std::allocator<bool>_>::vector(&local_a0.bitvector,&local_38->bitvector);
      analysis::
      VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ::transfer(&this->txfn->
                  super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                 ,bb,&local_a0);
      second = local_48;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_c8.bitvector,&local_48->bitvector);
      analysis::
      VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ::transfer(&this->txfn->
                  super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                 ,bb,&local_c8);
      checkMonotonicity(this,bb,local_40,local_38,&local_78,&local_a0);
      checkMonotonicity(this,bb,local_40,second,&local_78,&local_c8);
      checkMonotonicity(this,bb,local_38,second,&local_a0,&local_c8);
      if (local_c8.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_c8.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_c8.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_c8.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_a0.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_a0.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_a0.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_78.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      }
      bb = bb + 1;
    } while (bb != local_50);
  }
  return;
}

Assistant:

void checkTransferFunction(CFG& cfg,
                             typename L::Element x,
                             typename L::Element y,
                             typename L::Element z) {
    for (const auto& bb : cfg) {
      // Apply transfer function on each lattice element.
      auto xResult = x;
      txfn.transfer(bb, xResult);
      auto yResult = y;
      txfn.transfer(bb, yResult);
      auto zResult = z;
      txfn.transfer(bb, zResult);

      // Check monotonicity for every pair of transfer function outputs.
      checkMonotonicity(bb, x, y, xResult, yResult);
      checkMonotonicity(bb, x, z, xResult, zResult);
      checkMonotonicity(bb, y, z, yResult, zResult);
    }
  }